

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TiledOutputFile::TiledOutputFile(TiledOutputFile *this,OutputPartData *part)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  Data *pDVar3;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__TiledOutputFile_001e4448;
  this->_deleteStream = false;
  psVar2 = Header::type_abi_cxx11_(&part->header);
  __n = psVar2->_M_string_length;
  if (__n == _DAT_001e8340) {
    if (__n != 0) {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_001a7c63;
    }
    this->_streamData = part->mutex;
    pDVar3 = (Data *)operator_new(0x178);
    Data::Data(pDVar3,part->numThreads);
    this->_data = pDVar3;
    pDVar3->multipart = part->multipart;
    initialize(this,&part->header);
    pDVar3 = this->_data;
    pDVar3->partNumber = part->partNumber;
    pDVar3->tileOffsetsPosition = part->chunkOffsetTablePosition;
    pDVar3->previewPosition = part->previewPosition;
    return;
  }
LAB_001a7c63:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Can\'t build a TiledOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

TiledOutputFile::TiledOutputFile (const OutputPartData* part)
    : _deleteStream (false)
{
    try
    {
        if (part->header.type () != TILEDIMAGE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a TiledOutputFile from a type-mismatched part.");

        _streamData      = part->mutex;
        _data            = new Data (part->numThreads);
        _data->multipart = part->multipart;
        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->tileOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}